

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O1

cmArgumentParser<cmCoreTryCompile::Arguments> *
anon_unknown.dwarf_1ec656a::makeTryRunParser
          (cmArgumentParser<cmCoreTryCompile::Arguments> *__return_storage_ptr__,
          cmArgumentParser<cmCoreTryCompile::Arguments> *base)

{
  cmArgumentParser<cmCoreTryCompile::Arguments> *pcVar1;
  ActionMap *pAVar2;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  ActionMap local_80;
  
  ArgumentParser::ActionMap::ActionMap(&local_80,(ActionMap *)base);
  name.super_string_view._M_str = "COMPILE_OUTPUT_VARIABLE";
  name.super_string_view._M_len = 0x17;
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     ((cmArgumentParser<cmCoreTryCompile::Arguments> *)&local_80,name,0x2b0);
  name_00.super_string_view._M_str = "RUN_OUTPUT_VARIABLE";
  name_00.super_string_view._M_len = 0x13;
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,name_00,0x2d8);
  name_01.super_string_view._M_str = "RUN_OUTPUT_STDOUT_VARIABLE";
  name_01.super_string_view._M_len = 0x1a;
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,name_01,0x300);
  name_02.super_string_view._M_str = "RUN_OUTPUT_STDERR_VARIABLE";
  name_02.super_string_view._M_len = 0x1a;
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,name_02,0x328);
  name_03.super_string_view._M_str = "WORKING_DIRECTORY";
  name_03.super_string_view._M_len = 0x11;
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar1,name_03,0x350);
  name_04.super_string_view._M_str = "ARGS";
  name_04.super_string_view._M_len = 4;
  pAVar2 = (ActionMap *)
           cmArgumentParser<cmCoreTryCompile::Arguments>::
           Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar1,name_04,0x378);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)__return_storage_ptr__,pAVar2);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_80.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_80.ParsedKeyword.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)&local_80.ParsedKeyword,(_Any_data *)&local_80.ParsedKeyword,
               __destroy_functor);
  }
  if (local_80.KeywordMissingValue.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)&local_80.KeywordMissingValue,(_Any_data *)&local_80.KeywordMissingValue
               ,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

cmArgumentParser<Arguments> makeTryRunParser(
  const cmArgumentParser<Arguments>& base)
{
  return cmArgumentParser<Arguments>{ base }
    .Bind("COMPILE_OUTPUT_VARIABLE"_s, &Arguments::CompileOutputVariable)
    .Bind("RUN_OUTPUT_VARIABLE"_s, &Arguments::RunOutputVariable)
    .Bind("RUN_OUTPUT_STDOUT_VARIABLE"_s, &Arguments::RunOutputStdOutVariable)
    .Bind("RUN_OUTPUT_STDERR_VARIABLE"_s, &Arguments::RunOutputStdErrVariable)
    .Bind("WORKING_DIRECTORY"_s, &Arguments::RunWorkingDirectory)
    .Bind("ARGS"_s, &Arguments::RunArgs)
    /* keep semicolon on own line */;
}